

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

string * __thiscall
picojson::parse_abi_cxx11_(string *__return_storage_ptr__,picojson *this,value *out,istream *is)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char local_a8 [72];
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> local_60;
  default_parse_context local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60.cur_._M_sbuf = *(streambuf_type **)((long)&out[0xe].u_ + *(long *)(*(long *)out + -0x18))
  ;
  local_60.cur_._M_c = -1;
  local_60.end_._M_sbuf = (streambuf_type *)0x0;
  local_60.end_._M_c = -1;
  local_60.last_ch_ = -1;
  local_60.ungot_ = false;
  local_60.line_ = 1;
  local_30.out_ = (value *)this;
  bVar2 = _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                    (&local_30,&local_60);
  if (!bVar2) {
    snprintf(local_a8,0x40,"syntax error at line %d near: ",(ulong)(uint)local_60.line_);
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(local_a8);
    __stream = (FILE *)0x0;
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)local_a8);
    while( true ) {
      iVar3 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc
                        (&local_60,__stream);
      if ((iVar3 == -1) || (iVar3 == 10)) break;
      if (0x1f < iVar3) {
        __stream = (FILE *)(ulong)(uint)(int)(char)iVar3;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string parse(value& out, std::istream& is) {
    std::string err;
    parse(out, std::istreambuf_iterator<char>(is.rdbuf()),
      std::istreambuf_iterator<char>(), &err);
    return err;
  }